

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

S2Point * __thiscall S2Polygon::GetCentroid(S2Point *__return_storage_ptr__,S2Polygon *this)

{
  uint uVar1;
  uint uVar2;
  S2Loop *pSVar3;
  size_t *siglen;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  uchar *in_R8;
  size_t in_R9;
  S2Point local_50;
  int local_34;
  Vector3<double> local_30;
  uint local_14;
  S2Polygon *pSStack_10;
  int i;
  S2Polygon *this_local;
  
  pSStack_10 = this;
  Vector3<double>::Vector3(__return_storage_ptr__);
  local_14 = 0;
  while( true ) {
    uVar1 = local_14;
    uVar2 = num_loops(this);
    siglen = (size_t *)(ulong)uVar2;
    if ((int)uVar2 <= (int)uVar1) break;
    ctx = (EVP_PKEY_CTX *)(ulong)local_14;
    pSVar3 = loop(this,local_14);
    local_34 = S2Loop::sign(pSVar3,ctx,sig,siglen,in_R8,in_R9);
    pSVar3 = loop(this,local_14);
    S2Loop::GetCentroid(&local_50,pSVar3);
    util::math::internal_vector::operator*
              (&local_30,&local_34,(BasicVector<Vector3,_double,_3UL> *)&local_50);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+=
              ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,&local_30);
    local_14 = local_14 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Polygon::GetCentroid() const {
  S2Point centroid;
  for (int i = 0; i < num_loops(); ++i) {
    centroid += loop(i)->sign() * loop(i)->GetCentroid();
  }
  return centroid;
}